

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O2

void __thiscall llvm::DWARFDebugLine::ParsingState::ParsingState(ParsingState *this,LineTable *LT)

{
  this->LineTable = LT;
  Row::Row(&this->Row,false);
  Sequence::Sequence(&this->Sequence);
  resetRowAndSequence(this);
  return;
}

Assistant:

DWARFDebugLine::ParsingState::ParsingState(struct LineTable *LT)
    : LineTable(LT) {
  resetRowAndSequence();
}